

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigCanon.c
# Opt level: O3

Aig_RMan_t * Aig_RManStart(void)

{
  uint uVar1;
  uint uVar2;
  Aig_RMan_t *pAVar3;
  Aig_Man_t *p;
  Aig_Tru_t **ppAVar4;
  Aig_MmFlex_t *pAVar5;
  Bdc_Man_t *pBVar6;
  uint uVar7;
  int iVar8;
  
  pAVar3 = (Aig_RMan_t *)calloc(1,0xd78);
  pAVar3->nVars = 0xc;
  p = Aig_ManStart(1000000);
  pAVar3->pAig = p;
  Aig_IthVar(p,0xb);
  uVar7 = 4999;
  while( true ) {
    do {
      uVar1 = uVar7 + 1;
      uVar2 = uVar7 & 1;
      uVar7 = uVar1;
    } while (uVar2 != 0);
    if (uVar1 < 9) break;
    iVar8 = 5;
    while (uVar1 % (iVar8 - 2U) != 0) {
      uVar2 = iVar8 * iVar8;
      iVar8 = iVar8 + 2;
      if (uVar1 < uVar2) goto LAB_006bbb75;
    }
  }
LAB_006bbb75:
  pAVar3->nBins = uVar1;
  ppAVar4 = (Aig_Tru_t **)calloc((long)(int)uVar1,8);
  pAVar3->pBins = ppAVar4;
  pAVar5 = Aig_MmFlexStart();
  pAVar3->pMemTrus = pAVar5;
  Aig_RManStart::Pars.nVarsMax = 0xc;
  Aig_RManStart::Pars.fVerbose = 0;
  pBVar6 = Bdc_ManAlloc(&Aig_RManStart::Pars);
  pAVar3->pBidec = pBVar6;
  return pAVar3;
}

Assistant:

Aig_RMan_t * Aig_RManStart()
{
    static Bdc_Par_t Pars = {0}, * pPars = &Pars;
    Aig_RMan_t * p;
    p = ABC_ALLOC( Aig_RMan_t, 1 );
    memset( p, 0, sizeof(Aig_RMan_t) );
    p->nVars = RMAN_MAXVARS;
    p->pAig  = Aig_ManStart( 1000000 );
    Aig_IthVar( p->pAig, p->nVars-1 );
    // create hash table
    p->nBins = Abc_PrimeCudd(5000);
    p->pBins = ABC_CALLOC( Aig_Tru_t *, p->nBins );
    p->pMemTrus = Aig_MmFlexStart();
    // bi-decomposition manager
    pPars->nVarsMax = p->nVars;
    pPars->fVerbose = 0;
    p->pBidec = Bdc_ManAlloc( pPars );
    return p;
}